

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.h
# Opt level: O0

void yyml::nn::SubstractBackward<double>
               (Variable<double> *va,Variable<double> *vb,Variable<double> *result)

{
  double *pdVar1;
  size_t sVar2;
  int local_24;
  int i;
  Variable<double> *result_local;
  Variable<double> *vb_local;
  Variable<double> *va_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = Tensor<double>::total(&result->grads_);
    if (sVar2 <= (ulong)(long)local_24) break;
    pdVar1 = (va->grads_).data_;
    pdVar1[local_24] = (result->grads_).data_[local_24] + pdVar1[local_24];
    pdVar1 = (vb->grads_).data_;
    pdVar1[local_24] = pdVar1[local_24] - (result->grads_).data_[local_24];
    local_24 = local_24 + 1;
  }
  Factory<yyml::nn::Variable<double>_>::RemoveInstance(result);
  return;
}

Assistant:

void SubstractBackward(Variable<Type>* va, Variable<Type>* vb,
                       Variable<Type>* result) {
  for (int i = 0; i < result->grads_.total(); i++) {
    /* dL      dL      d(upper)          dL
     * -- = -------- * ----------- =  -------- * 1
     * dx   d(upper)      dx          d(upper)
     *
     */
    va->grads_.data_[i] += result->grads_.data_[i];
    vb->grads_.data_[i] -= result->grads_.data_[i];
  }
  Variable<Type>::factory::RemoveInstance(result);
}